

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::handle_condition_options(vw *all,auto_condition_settings *acset)

{
  typed_option<float> *op;
  typed_option<bool> *this;
  long in_RDI;
  option_group_definition new_options;
  typed_option<float> *in_stack_fffffffffffff898;
  typed_option<float> *in_stack_fffffffffffff8a0;
  string *in_stack_fffffffffffff8a8;
  allocator *paVar1;
  typed_option<float> *in_stack_fffffffffffff8b0;
  typed_option<unsigned_long> *in_stack_fffffffffffff8e8;
  option_group_definition *in_stack_fffffffffffff8f0;
  option_group_definition *this_00;
  allocator local_6b9;
  string local_6b8 [39];
  allocator local_691;
  string local_690 [32];
  typed_option<bool> local_670 [2];
  allocator local_529;
  string local_528 [39];
  allocator local_501;
  string local_500 [32];
  typed_option<float> local_4e0 [2];
  undefined1 local_399 [40];
  allocator local_371;
  string local_370 [32];
  typed_option<unsigned_long> local_350 [2];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [32];
  typed_option<unsigned_long> local_1c0 [2];
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Search Auto-conditioning Options",&local_69);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff8a0,
             (string *)in_stack_fffffffffffff898);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"search_max_bias_ngram_length",&local_1e1);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff8a8,(unsigned_long *)in_stack_fffffffffffff8a0);
  VW::config::typed_option<unsigned_long>::keep(local_1c0,true);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff8b0,
             (unsigned_long)in_stack_fffffffffffff8a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_208,
             "add a \"bias\" feature for each ngram up to and including this length. eg., if it\'s 1 (default), then you get a single feature for each conditional"
             ,&local_209);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff8a0,
             (string *)in_stack_fffffffffffff898);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff8a0,
             (typed_option<unsigned_long> *)in_stack_fffffffffffff898);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff8a0);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff8a0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"search_max_quad_ngram_length",&local_371);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff8a8,(unsigned_long *)in_stack_fffffffffffff8a0);
  VW::config::typed_option<unsigned_long>::keep(local_350,true);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff8b0,
             (unsigned_long)in_stack_fffffffffffff8a8);
  this_00 = (option_group_definition *)local_399;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_399 + 1),
             "add bias *times* input features for each ngram up to and including this length (def: 0)"
             ,(allocator *)this_00);
  op = (typed_option<float> *)
       VW::config::typed_option<unsigned_long>::help
                 ((typed_option<unsigned_long> *)in_stack_fffffffffffff8a0,
                  (string *)in_stack_fffffffffffff898);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff8a0,
             (typed_option<unsigned_long> *)in_stack_fffffffffffff898);
  VW::config::option_group_definition::add<unsigned_long>(this_00,(typed_option<unsigned_long> *)op)
  ;
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff8a0);
  std::__cxx11::string::~string((string *)(local_399 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_399);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff8a0);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_500,"search_condition_feature_value",&local_501);
  VW::config::make_option<float>(in_stack_fffffffffffff8a8,(float *)in_stack_fffffffffffff8a0);
  VW::config::typed_option<float>::keep(local_4e0,true);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff8b0,(float)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_528,"how much weight should the conditional features get? (def: 1.)",&local_529);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff8a0,(string *)in_stack_fffffffffffff898);
  VW::config::typed_option<float>::typed_option(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898)
  ;
  VW::config::option_group_definition::add<float>(this_00,op);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff8a0);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff8a0);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_690,"search_use_passthrough_repr",&local_691);
  VW::config::make_option<bool>(in_stack_fffffffffffff8a8,(bool *)in_stack_fffffffffffff8a0);
  VW::config::typed_option<bool>::keep(local_670,true);
  paVar1 = &local_6b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6b8,
             "should we use lower-level reduction _internal state_ as additional features? (def: no)"
             ,paVar1);
  this = VW::config::typed_option<bool>::help
                   ((typed_option<bool> *)in_stack_fffffffffffff8a0,
                    (string *)in_stack_fffffffffffff898);
  VW::config::typed_option<bool>::typed_option(this,(typed_option<bool> *)in_stack_fffffffffffff898)
  ;
  VW::config::option_group_definition::add<bool>(this_00,(typed_option<bool> *)op);
  VW::config::typed_option<bool>::~typed_option(this);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  VW::config::typed_option<bool>::~typed_option(this);
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  (**(code **)**(undefined8 **)(local_8 + 0x278))(*(undefined8 **)(local_8 + 0x278),local_48);
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)this);
  return;
}

Assistant:

void handle_condition_options(vw& all, auto_condition_settings& acset)
{
  option_group_definition new_options("Search Auto-conditioning Options");
  new_options.add(make_option("search_max_bias_ngram_length", acset.max_bias_ngram_length)
                      .keep()
                      .default_value(1)
                      .help("add a \"bias\" feature for each ngram up to and including this length. eg., if it's 1 "
                            "(default), then you get a single feature for each conditional"));
  new_options.add(make_option("search_max_quad_ngram_length", acset.max_quad_ngram_length)
                      .keep()
                      .default_value(0)
                      .help("add bias *times* input features for each ngram up to and including this length (def: 0)"));
  new_options.add(make_option("search_condition_feature_value", acset.feature_value)
                      .keep()
                      .default_value(1.f)
                      .help("how much weight should the conditional features get? (def: 1.)"));
  new_options.add(make_option("search_use_passthrough_repr", acset.use_passthrough_repr)
                      .keep()
                      .help("should we use lower-level reduction _internal state_ as additional features? (def: no)"));
  all.options->add_and_parse(new_options);
}